

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

any __thiscall Json::init_right_of_pair(Json *this,string *s,size_t *start)

{
  char c;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  any *paVar5;
  ulong uVar6;
  undefined8 *puVar7;
  size_t *in_RCX;
  _Storage extraout_RDX;
  _Storage extraout_RDX_00;
  _Storage extraout_RDX_01;
  _Storage extraout_RDX_02;
  _Storage _Var8;
  _Storage extraout_RDX_03;
  long *plVar9;
  size_t current;
  any aVar10;
  string str;
  JsonTools j;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [48];
  vector<std::any,_std::allocator<std::any>_> local_a8;
  ulong local_90;
  size_t *local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_80;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  current = *in_RCX;
  *(undefined8 *)&(this->object)._M_t._M_impl = 0;
  *(undefined8 *)&(this->object)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  c = *(char *)(*start + current);
  local_88 = in_RCX;
  if (c == '{') {
    sVar4 = JsonTools::size_of_item((string *)start,current,'{','}');
    std::__cxx11::string::substr((ulong)local_d8,(ulong)start);
    std::__cxx11::string::operator=((string *)&local_f8,(string *)local_d8);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    Json((Json *)local_d8,&local_f8);
    std::any::operator=((any *)this,(Json *)local_d8);
  }
  else {
    if (c != '[') {
      if (c == '\"') {
        JsonTools::parse_string_literally((string *)local_d8,(string *)start,current + 1);
        std::__cxx11::string::operator=((string *)&local_f8,(string *)local_d8);
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
        sVar1 = local_f8._M_string_length;
        std::any::operator=((any *)this,&local_f8);
        current = current + sVar1 + 1;
        _Var8 = extraout_RDX;
      }
      else {
        bVar2 = JsonTools::is_digit(c);
        if (bVar2) {
          JsonTools::parse_number((string *)local_d8,(string *)start,*local_88);
          std::__cxx11::string::operator=((string *)&local_f8,(string *)local_d8);
          if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          }
          sVar1 = local_f8._M_string_length;
          local_d8._0_8_ = atof(local_f8._M_dataplus._M_p);
          std::any::operator=((any *)this,(double *)local_d8);
          current = (current + sVar1) - 1;
          _Var8 = extraout_RDX_01;
        }
        else {
          JsonTools::JsonTools((JsonTools *)local_d8);
          if ((long *)local_d8._16_8_ == (long *)0x0) {
            uVar6 = 0;
          }
          else {
            local_90 = 0;
            plVar9 = (long *)local_d8._16_8_;
            do {
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
              ::pair(&local_80,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                      *)(plVar9 + 1));
              std::__cxx11::string::substr((ulong)&local_50,(ulong)start);
              if (local_48 == local_80.first._M_string_length) {
                if (local_48 == 0) {
                  bVar2 = true;
                }
                else {
                  iVar3 = bcmp(local_50,local_80.first._M_dataplus._M_p,local_48);
                  bVar2 = iVar3 == 0;
                }
              }
              else {
                bVar2 = false;
              }
              if (local_50 != local_40) {
                operator_delete(local_50,local_40[0] + 1);
              }
              sVar1 = local_80.first._M_string_length;
              if (bVar2) {
                paVar5 = std::any::operator=((any *)this,&local_80.second);
                current = current + sVar1;
                local_90 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
              }
              if (local_80.second._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
                (*local_80.second._M_manager)(_Op_destroy,&local_80.second,(_Arg *)0x0);
                local_80.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
                operator_delete(local_80.first._M_dataplus._M_p,
                                local_80.first.field_2._M_allocated_capacity + 1);
              }
              uVar6 = local_90;
            } while ((!bVar2) && (plVar9 = (long *)*plVar9, plVar9 != (long *)0x0));
          }
          if ((uVar6 & 1) == 0) {
            puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
            *puVar7 = &PTR__exception_0013e3a8;
            puVar7[1] = "Unexpected symbol!";
            __cxa_throw(puVar7,&json_exception::JsonException::typeinfo,std::exception::~exception);
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_d8);
          _Var8 = extraout_RDX_02;
        }
      }
      goto LAB_00109e28;
    }
    sVar4 = JsonTools::size_of_item((string *)start,current,'[',']');
    std::__cxx11::string::substr((ulong)local_d8,(ulong)start);
    std::__cxx11::string::operator=((string *)&local_f8,(string *)local_d8);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    Json((Json *)local_d8,&local_f8);
    std::any::operator=((any *)this,(Json *)local_d8);
  }
  std::vector<std::any,_std::allocator<std::any>_>::~vector(&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)local_d8);
  current = current + sVar4;
  _Var8 = extraout_RDX_00;
LAB_00109e28:
  *local_88 = current;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
    _Var8 = extraout_RDX_03;
  }
  aVar10._M_storage._M_ptr = _Var8._M_ptr;
  aVar10._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return aVar10;
}

Assistant:

any Json::init_right_of_pair(string& s, size_t& start) {
	size_t i = start;
	any value;
	string str;
	if (s[i] == '\"') {
		str = JsonTools::parse_string_literally(s, start + 1);
		i += str.size() + 1;
		value = str;
	} else if (s[i] == '[') {
		size_t end = JsonTools::size_of_item(s, i, '[', ']');
		str = s.substr(i, end);
		value = Json(str);
		i += end;
	} else if (s[i] == '{') {
		size_t end = JsonTools::size_of_item(s, i, '{', '}');
		str = s.substr(i, end);
		value = Json(str);
		i += end;
	} else if (JsonTools::is_digit(s[i])) {
		str = JsonTools::parse_number(s, start);
		i += str.size() - 1;
		value = atof(str.c_str());
	} else {
		bool gotit = false;
		JsonTools j;
		for (auto p : j.allowedLexems) {
			if (s.substr(i, p.first.length()) == p.first) {
				i += p.first.length();
				value = p.second;
				gotit = true;
				break;
			}
		}
		if (!gotit) throw json_exception::JsonException("Unexpected symbol!");
	}
	start = i;
	return value;
}